

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O0

time_double
time_function<long,libdivide::divider<long,(libdivide::Branching)0>>
          (random_numerators<long> *vals,divider<long,_(libdivide::Branching)0> denom,
          pFuncToTime<long,_libdivide::divider<long>_> timeFunc)

{
  time_double tVar1;
  uint64_t uVar2;
  code *in_RCX;
  undefined8 in_RDI;
  timer t;
  time_double tresult;
  timer local_60;
  code *local_40;
  undefined8 local_38;
  undefined1 local_20 [24];
  uint64_t local_8;
  
  local_40 = in_RCX;
  local_38 = in_RDI;
  timer::timer(&local_60);
  timer::start((timer *)0x103202);
  local_8 = (*local_40)(local_38,local_20);
  timer::stop((timer *)0x103221);
  uVar2 = timer::duration_nano(&local_60);
  tVar1.result = local_8;
  tVar1.time = uVar2;
  return tVar1;
}

Assistant:

NOINLINE static time_double time_function(
    const random_numerators<IntT> &vals, DenomT denom, pFuncToTime<IntT, DenomT> timeFunc) {
    time_double tresult;

    timer t;
    t.start();
    tresult.result = timeFunc(vals, denom);
    t.stop();
    tresult.time = t.duration_nano();
    return tresult;
}